

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::renderTestPattern
          (LineRenderCase *this,IterationConfig *config)

{
  code *pcVar1;
  code *pcVar2;
  int iVar3;
  deUint32 dVar4;
  deBool dVar5;
  undefined4 uVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  ShaderProgram *pSVar8;
  TestError *this_00;
  TestLog *pTVar9;
  MessageBuilder *pMVar10;
  undefined8 uVar11;
  float local_384;
  MessageBuilder local_338;
  MessageBuilder local_1b8;
  float local_28;
  int local_24;
  GLfloat tessLevel;
  GLint tessLevelPos;
  Functions *gl;
  IterationConfig *config_local;
  LineRenderCase *this_local;
  
  gl = (Functions *)config;
  config_local = (IterationConfig *)this;
  pRVar7 = Context::getRenderContext((this->super_BBoxRenderCase).super_TestCase.m_context);
  iVar3 = (*pRVar7->_vptr_RenderContext[3])();
  _tessLevel = CONCAT44(extraout_var,iVar3);
  BBoxRenderCase::setupRender(&this->super_BBoxRenderCase,(IterationConfig *)gl);
  if (((this->super_BBoxRenderCase).m_hasTessellationStage & 1U) != 0) {
    pcVar1 = *(code **)(_tessLevel + 0xb48);
    pSVar8 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
             operator->(&(this->super_BBoxRenderCase).m_program.
                         super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                       );
    dVar4 = glu::ShaderProgram::getProgram(pSVar8);
    local_24 = (*pcVar1)(dVar4,"u_tessellationLevel");
    local_28 = 2.8;
    do {
      dVar5 = ::deGetFalse();
      if ((dVar5 != 0) || (local_24 == -1)) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,"tessLevelPos != -1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                   ,0x70e);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar5 = ::deGetFalse();
    } while (dVar5 != 0);
    pTVar9 = tcu::TestContext::getLog
                       ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
    tcu::TestLog::operator<<(&local_1b8,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<(&local_1b8,(char (*) [23])"u_tessellationLevel = ");
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_28);
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    (**(code **)(_tessLevel + 0x14e0))(0x40333333,local_24);
    (**(code **)(_tessLevel + 0xfd8))(0x8e72,2);
    dVar4 = (**(code **)(_tessLevel + 0x800))();
    glu::checkError(dVar4,"patch param",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0x714);
  }
  if ((this->m_isWideLineCase & 1U) != 0) {
    (**(code **)(_tessLevel + 0xce0))((float)this->m_wideLineLineWidth);
  }
  pcVar1 = *(code **)(_tessLevel + 0x14e0);
  pcVar2 = *(code **)(_tessLevel + 0xb48);
  pSVar8 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
           operator->(&(this->super_BBoxRenderCase).m_program.
                       super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                     );
  dVar4 = glu::ShaderProgram::getProgram(pSVar8);
  uVar6 = (*pcVar2)(dVar4,"u_lineWidth");
  if ((this->m_isWideLineCase & 1U) == 0) {
    local_384 = 1.0;
  }
  else {
    local_384 = (float)this->m_wideLineLineWidth;
  }
  (*pcVar1)(local_384,uVar6);
  pTVar9 = tcu::TestContext::getLog
                     ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  tcu::TestLog::operator<<(&local_338,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<(&local_338,(char (*) [19])"Rendering pattern.");
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_338);
  (**(code **)(_tessLevel + 0x5e0))(0xbe2);
  (**(code **)(_tessLevel + 0x120))(1);
  (**(code **)(_tessLevel + 0x100))(0x8006);
  uVar11 = 1;
  if (((this->super_BBoxRenderCase).m_hasTessellationStage & 1U) != 0) {
    uVar11 = 0xe;
  }
  (**(code **)(_tessLevel + 0x538))
            (uVar11,0,*(int *)&(this->super_BBoxRenderCase).field_0xd4 *
                      *(int *)&(this->super_BBoxRenderCase).field_0xd4 * 4);
  dVar4 = (**(code **)(_tessLevel + 0x800))();
  glu::checkError(dVar4,"draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                  ,0x723);
  return;
}

Assistant:

void LineRenderCase::renderTestPattern (const IterationConfig& config)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	setupRender(config);

	if (m_hasTessellationStage)
	{
		const glw::GLint	tessLevelPos	= gl.getUniformLocation(m_program->getProgram(), "u_tessellationLevel");
		const glw::GLfloat	tessLevel		= 2.8f; // will be rounded up

		TCU_CHECK(tessLevelPos != -1);

		m_testCtx.getLog() << tcu::TestLog::Message << "u_tessellationLevel = " << tessLevel << tcu::TestLog::EndMessage;

		gl.uniform1f(tessLevelPos, tessLevel);
		gl.patchParameteri(GL_PATCH_VERTICES, 2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "patch param");
	}

	if (m_isWideLineCase)
		gl.lineWidth((float)m_wideLineLineWidth);

	gl.uniform1f(gl.getUniformLocation(m_program->getProgram(), "u_lineWidth"), (m_isWideLineCase) ? ((float)m_wideLineLineWidth) : (1.0f));

	m_testCtx.getLog() << tcu::TestLog::Message << "Rendering pattern." << tcu::TestLog::EndMessage;

	gl.enable(GL_BLEND);
	gl.blendFunc(GL_ONE, GL_ONE);
	gl.blendEquation(GL_FUNC_ADD);

	gl.drawArrays((m_hasTessellationStage) ? (GL_PATCHES) : (GL_LINES), 0, m_patternSide * m_patternSide * 2 * 2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "draw");
}